

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

wchar_t next_entry(archive_read_disk *a,tree *t,archive_entry *entry)

{
  wchar_t wVar1;
  mode_t mVar2;
  int iVar3;
  wchar_t *pwVar4;
  char *pcVar5;
  int *piVar6;
  time_t tVar7;
  long lVar8;
  la_int64_t lVar9;
  uint local_6c;
  undefined1 auStack_68 [4];
  wchar_t stflags;
  archive_string delayed_str;
  wchar_t r;
  wchar_t descend;
  wchar_t delayed_errno;
  wchar_t delayed;
  char *name;
  stat_conflict *lst;
  stat_conflict *st;
  archive_entry *entry_local;
  tree *t_local;
  archive_read_disk *a_local;
  
  descend = L'\0';
  r = L'\0';
  _auStack_68 = (char *)0x0;
  delayed_str.s = (char *)0x0;
  delayed_str.length = 0;
  name = (char *)0x0;
  t->descend = 0;
  do {
    wVar1 = tree_next(t);
    switch(wVar1) {
    case L'\0':
      tree_enter_initial_dir(t);
      return L'\x01';
    case L'\x01':
      name = (char *)tree_current_lstat(t);
      if ((stat_conflict *)name == (stat_conflict *)0x0) {
        piVar6 = __errno_location();
        if ((*piVar6 != 2) || (t->depth < 1)) {
          piVar6 = __errno_location();
          iVar3 = *piVar6;
          pcVar5 = tree_current_path(t);
          archive_set_error(&a->archive,iVar3,"%s: Cannot stat",pcVar5);
          tree_enter_initial_dir(t);
          return L'\xffffffe7';
        }
        descend = L'\xffffffec';
        pwVar4 = __errno_location();
        r = *pwVar4;
        if (delayed_str.s == (char *)0x0) {
          pcVar5 = tree_current_path(t);
          archive_string_sprintf((archive_string *)auStack_68,"%s",pcVar5);
        }
        else {
          pcVar5 = tree_current_path(t);
          archive_string_sprintf((archive_string *)auStack_68," %s",pcVar5);
        }
      }
      break;
    case L'\x02':
    case L'\x03':
      break;
    case L'\xfffffffe':
      iVar3 = t->tree_errno;
      pcVar5 = tree_current_path(t);
      archive_set_error(&a->archive,iVar3,"%s: Unable to continue traversing directory tree",pcVar5)
      ;
      (a->archive).state = 0x8000;
      tree_enter_initial_dir(t);
      return L'\xffffffe2';
    case L'\xffffffff':
      pcVar5 = tree_current_path(t);
      archive_set_error(&a->archive,-1,"%s: Couldn\'t visit directory",pcVar5);
      tree_enter_initial_dir(t);
      return L'\xffffffe7';
    }
  } while (name == (char *)0x0);
  pcVar5 = tree_current_path(t);
  archive_entry_copy_pathname(entry,pcVar5);
  if (a->matching != (archive *)0x0) {
    delayed_str.buffer_length._0_4_ = archive_match_path_excluded(a->matching,entry);
    if ((wchar_t)delayed_str.buffer_length < L'\0') {
      piVar6 = __errno_location();
      iVar3 = *piVar6;
      pcVar5 = archive_error_string(a->matching);
      archive_set_error(&a->archive,iVar3,"Failed : %s",pcVar5);
      return (wchar_t)delayed_str.buffer_length;
    }
    if ((wchar_t)delayed_str.buffer_length != L'\0') {
      if (a->excluded_cb_func != (_func_void_archive_ptr_void_ptr_archive_entry_ptr *)0x0) {
        (*a->excluded_cb_func)(&a->archive,a->excluded_cb_data,entry);
      }
      return L'\xfffffff6';
    }
    delayed_str.buffer_length._0_4_ = 0;
  }
  if (t->symlink_mode == 'H') {
    t->symlink_mode = 'P';
LAB_0011b0cb:
    delayed_str.buffer_length._4_4_ = tree_current_is_dir(t);
    a->symlink_mode = 'L';
    a->follow_symlinks = '\x01';
    lst = tree_current_stat(t);
    if ((lst != (stat_conflict *)0x0) &&
       (wVar1 = tree_target_is_same_as_parent(t,lst), wVar1 == L'\0')) goto LAB_0011b141;
  }
  else if (t->symlink_mode == 'L') goto LAB_0011b0cb;
  delayed_str.buffer_length._4_4_ = tree_current_is_physical_dir(t);
  a->symlink_mode = 'P';
  a->follow_symlinks = '\0';
  lst = (stat_conflict *)name;
LAB_0011b141:
  wVar1 = update_current_filesystem(a,lst->st_dev);
  if (wVar1 != L'\0') {
    (a->archive).state = 0x8000;
    tree_enter_initial_dir(t);
    return L'\xffffffe2';
  }
  if (t->initial_filesystem_id == -1) {
    t->initial_filesystem_id = t->current_filesystem_id;
  }
  if (((a->flags & 8U) != 0) && (t->initial_filesystem_id != t->current_filesystem_id)) {
    delayed_str.buffer_length._4_4_ = L'\0';
  }
  t->descend = delayed_str.buffer_length._4_4_;
  if (((a->flags & 2U) != 0) &&
     (((lst->st_mode & 0xf000) == 0x8000 || ((lst->st_mode & 0xf000) == 0x4000)))) {
    pcVar5 = tree_current_access_path(t);
    wVar1 = open_on_current_dir(t,pcVar5,L'\x00080800');
    t->entry_fd = wVar1;
    __archive_ensure_cloexec_flag(t->entry_fd);
    if ((-1 < t->entry_fd) &&
       ((delayed_str.buffer_length._0_4_ = ioctl(t->entry_fd,0x80086601,&local_6c),
        (wchar_t)delayed_str.buffer_length == 0 && ((local_6c & 0x40) != 0)))) {
      return L'\xfffffff6';
    }
  }
  archive_entry_copy_stat(entry,lst);
  tVar7 = archive_entry_mtime(entry);
  (t->restore_time).mtime = tVar7;
  lVar8 = archive_entry_mtime_nsec(entry);
  (t->restore_time).mtime_nsec = lVar8;
  tVar7 = archive_entry_atime(entry);
  (t->restore_time).atime = tVar7;
  lVar8 = archive_entry_atime_nsec(entry);
  (t->restore_time).atime_nsec = lVar8;
  mVar2 = archive_entry_filetype(entry);
  (t->restore_time).filetype = mVar2;
  (t->restore_time).noatime = t->current_filesystem->noatime;
  if (a->matching != (archive *)0x0) {
    delayed_str.buffer_length._0_4_ = archive_match_time_excluded(a->matching,entry);
    if ((wchar_t)delayed_str.buffer_length < L'\0') {
      piVar6 = __errno_location();
      iVar3 = *piVar6;
      pcVar5 = archive_error_string(a->matching);
      archive_set_error(&a->archive,iVar3,"Failed : %s",pcVar5);
      return (wchar_t)delayed_str.buffer_length;
    }
    if ((wchar_t)delayed_str.buffer_length != L'\0') {
      if (a->excluded_cb_func != (_func_void_archive_ptr_void_ptr_archive_entry_ptr *)0x0) {
        (*a->excluded_cb_func)(&a->archive,a->excluded_cb_data,entry);
      }
      return L'\xfffffff6';
    }
    delayed_str.buffer_length._0_4_ = 0;
  }
  lVar9 = archive_entry_uid(entry);
  pcVar5 = archive_read_disk_uname(&a->archive,lVar9);
  if (pcVar5 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar5);
  }
  lVar9 = archive_entry_gid(entry);
  pcVar5 = archive_read_disk_gname(&a->archive,lVar9);
  if (pcVar5 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar5);
  }
  if (a->matching != (archive *)0x0) {
    delayed_str.buffer_length._0_4_ = archive_match_owner_excluded(a->matching,entry);
    if ((wchar_t)delayed_str.buffer_length < L'\0') {
      piVar6 = __errno_location();
      iVar3 = *piVar6;
      pcVar5 = archive_error_string(a->matching);
      archive_set_error(&a->archive,iVar3,"Failed : %s",pcVar5);
      return (wchar_t)delayed_str.buffer_length;
    }
    if ((wchar_t)delayed_str.buffer_length != L'\0') {
      if (a->excluded_cb_func != (_func_void_archive_ptr_void_ptr_archive_entry_ptr *)0x0) {
        (*a->excluded_cb_func)(&a->archive,a->excluded_cb_data,entry);
      }
      return L'\xfffffff6';
    }
    delayed_str.buffer_length._0_4_ = 0;
  }
  if ((a->metadata_filter_func == (_func_int_archive_ptr_void_ptr_archive_entry_ptr *)0x0) ||
     (iVar3 = (*a->metadata_filter_func)(&a->archive,a->metadata_filter_data,entry), iVar3 != 0)) {
    pcVar5 = tree_current_access_path(t);
    archive_entry_copy_sourcepath(entry,pcVar5);
    delayed_str.buffer_length._0_4_ =
         archive_read_disk_entry_from_file(&a->archive,entry,t->entry_fd,lst);
    if (((wchar_t)delayed_str.buffer_length == L'\0') &&
       (delayed_str.buffer_length._0_4_ = descend, descend != L'\0')) {
      archive_string_sprintf((archive_string *)auStack_68,": %s","File removed before we read it");
      archive_set_error(&a->archive,r,"%s",_auStack_68);
    }
    archive_string_free((archive_string *)auStack_68);
    a_local._4_4_ = (wchar_t)delayed_str.buffer_length;
  }
  else {
    a_local._4_4_ = L'\xfffffff6';
  }
  return a_local._4_4_;
}

Assistant:

static struct links_entry *
next_entry(struct archive_entry_linkresolver *res, int mode)
{
	struct links_entry	*le;
	size_t			 bucket;

	/* Free a held entry. */
	if (res->spare != NULL) {
		archive_entry_free(res->spare->canonical);
		archive_entry_free(res->spare->entry);
		free(res->spare);
		res->spare = NULL;
	}

	/* Look for next non-empty bucket in the links cache. */
	for (bucket = 0; bucket < res->number_buckets; bucket++) {
		for (le = res->buckets[bucket]; le != NULL; le = le->next) {
			if (le->entry != NULL &&
			    (mode & NEXT_ENTRY_DEFERRED) == 0)
				continue;
			if (le->entry == NULL &&
			    (mode & NEXT_ENTRY_PARTIAL) == 0)
				continue;
			/* Remove it from this hash bucket. */
			if (le->next != NULL)
				le->next->previous = le->previous;
			if (le->previous != NULL)
				le->previous->next = le->next;
			else
				res->buckets[bucket] = le->next;
			res->number_entries--;
			/* Defer freeing this entry. */
			res->spare = le;
			return (le);
		}
	}
	return (NULL);
}